

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char * LoadFileText(char *fileName)

{
  uint uVar1;
  char *pcVar2;
  FILE *__stream;
  ulong uVar3;
  size_t sVar4;
  uint count;
  uint size;
  FILE *file;
  char *text;
  char *fileName_local;
  
  file = (FILE *)0x0;
  if (fileName == (char *)0x0) {
    TraceLog(4,"FILEIO: File name provided is not valid");
  }
  else {
    if (loadFileText != (LoadFileTextCallback)0x0) {
      pcVar2 = (*loadFileText)(fileName);
      return pcVar2;
    }
    __stream = fopen(fileName,"rt");
    if (__stream == (FILE *)0x0) {
      TraceLog(4,"FILEIO: [%s] Failed to open text file",fileName);
    }
    else {
      fseek(__stream,0,2);
      uVar3 = ftell(__stream);
      uVar1 = (uint)uVar3;
      fseek(__stream,0,0);
      if (uVar1 == 0) {
        TraceLog(4,"FILEIO: [%s] Failed to read text file",fileName);
      }
      else {
        file = (FILE *)malloc((ulong)(uVar1 + 1));
        sVar4 = fread(file,1,uVar3 & 0xffffffff,__stream);
        if ((uint)sVar4 < uVar1) {
          file = (FILE *)realloc(file,(ulong)((uint)sVar4 + 1));
        }
        *(undefined1 *)((long)&file->_flags + (sVar4 & 0xffffffff)) = 0;
        TraceLog(3,"FILEIO: [%s] Text file loaded successfully",fileName);
      }
      fclose(__stream);
    }
  }
  return (char *)file;
}

Assistant:

char *LoadFileText(const char *fileName)
{
    char *text = NULL;

    if (fileName != NULL)
    {
        if (loadFileText)
        {
            text = loadFileText(fileName);
            return text;
        }
#if defined(SUPPORT_STANDARD_FILEIO)
        FILE *file = fopen(fileName, "rt");

        if (file != NULL)
        {
            // WARNING: When reading a file as 'text' file,
            // text mode causes carriage return-linefeed translation...
            // ...but using fseek() should return correct byte-offset
            fseek(file, 0, SEEK_END);
            unsigned int size = (unsigned int)ftell(file);
            fseek(file, 0, SEEK_SET);

            if (size > 0)
            {
                text = (char *)RL_MALLOC((size + 1)*sizeof(char));
                unsigned int count = (unsigned int)fread(text, sizeof(char), size, file);

                // WARNING: \r\n is converted to \n on reading, so,
                // read bytes count gets reduced by the number of lines
                if (count < size) text = RL_REALLOC(text, count + 1);

                // Zero-terminate the string
                text[count] = '\0';

                TRACELOG(LOG_INFO, "FILEIO: [%s] Text file loaded successfully", fileName);
            }
            else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to read text file", fileName);

            fclose(file);
        }
        else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to open text file", fileName);
#else
    TRACELOG(LOG_WARNING, "FILEIO: Standard file io not supported, use custom file callback");
#endif
    }
    else TRACELOG(LOG_WARNING, "FILEIO: File name provided is not valid");

    return text;
}